

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O3

void __thiscall net_uv::KCPSocket::checkLogic(KCPSocket *this)

{
  ushort uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint32_t conv;
  uint32_t value;
  uint32_t value_00;
  string local_30;
  
  uVar2 = 0x157fb8;
  switch(this->m_kcpState) {
  case LISTEN:
    goto switchD_00144c40_caseD_0;
  case STOP_LISTEN:
    uVar2 = KCPSocketManager::count(this->m_socketMng);
    if (uVar2 == 0) break;
    KCPSocketManager::disconnectAll(this->m_socketMng);
    goto LAB_00144dc4;
  case SYN_SENT:
    uVar3 = uv_now((this->super_Socket).m_loop);
    if (uVar3 - this->m_stateTimeStamp < 0xbb9) {
      kcp_making_syn_abi_cxx11_(&local_30,(net_uv *)(ulong)(uint)this->m_randValue,value_00);
      udpSend(this,local_30._M_dataplus._M_p,(int32_t)local_30._M_string_length);
LAB_00144da9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      connectResult(this,2);
    }
    goto LAB_00144dc4;
  case SYN_RECV:
    uVar3 = uv_now((this->super_Socket).m_loop);
    if (uVar3 - this->m_stateTimeStamp < 0x1389) {
      kcp_making_syn_and_ack_abi_cxx11_
                (&local_30,(net_uv *)(ulong)(uint)this->m_randValue,this->m_conv,uVar2);
      udpSend(this,local_30._M_dataplus._M_p,(int32_t)local_30._M_string_length);
      goto LAB_00144da9;
    }
    this->m_kcpState = CLOSED;
    uVar3 = uv_now((this->super_Socket).m_loop);
    this->m_stateTimeStamp = uVar3;
    break;
  case ESTABLISHED:
    if (this->m_soType == CLI_SO) {
      uVar3 = uv_now((this->super_Socket).m_loop);
      if (uVar3 - this->m_stateTimeStamp < 2000) {
        kcp_making_ack_abi_cxx11_(&local_30,(net_uv *)(ulong)(this->m_conv + 1),value);
        udpSend(this,local_30._M_dataplus._M_p,(int32_t)local_30._M_string_length);
        goto LAB_00144da9;
      }
      goto LAB_00144dc4;
    }
    goto LAB_00144dd1;
  case FIN_WAIT:
  case CLOSE_WAIT:
    uVar3 = uv_now((this->super_Socket).m_loop);
    if (uVar3 - this->m_stateTimeStamp < 0x3e9) {
      kcp_making_fin_abi_cxx11_(&local_30,(net_uv *)(ulong)this->m_conv,conv);
      udpSend(this,local_30._M_dataplus._M_p,(int32_t)local_30._M_string_length);
      goto LAB_00144da9;
    }
  }
  shutdownSocket(this);
LAB_00144dc4:
  if (this->m_kcpState == ESTABLISHED) {
LAB_00144dd1:
    uVar3 = uv_now((this->super_Socket).m_loop);
    if (6000 < uVar3 - this->m_lastKcpRecvTime) {
      this->m_heartbeatLoseCount = this->m_heartbeatLoseCount + 1;
      uVar3 = uv_now((this->super_Socket).m_loop);
      this->m_lastKcpRecvTime = uVar3;
      uVar1 = this->m_heartbeatLoseCount;
      if (uVar1 < 10) {
        if (this->m_soType == CLI_SO) {
          if (uVar1 < 2) {
            return;
          }
          kcp_making_heart_packet_abi_cxx11_();
          udpSend(this,local_30._M_dataplus._M_p,(int32_t)local_30._M_string_length);
        }
        else {
          if (uVar1 < 5) {
            return;
          }
          kcp_making_heart_packet_abi_cxx11_();
          udpSend(this,local_30._M_dataplus._M_p,(int32_t)local_30._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        (*(this->super_Socket)._vptr_Socket[7])(this);
      }
    }
  }
switchD_00144c40_caseD_0:
  return;
}

Assistant:

void KCPSocket::checkLogic()
{
	switch (m_kcpState)
	{
	case State::LISTEN:
		break;
	case State::STOP_LISTEN:
	{
		if (m_socketMng->count() <= 0)
			shutdownSocket();
		else
			m_socketMng->disconnectAll();
	}
	break;
	case State::SYN_SENT:
	{
		// connect timeout
		if (uv_now(m_loop) - m_stateTimeStamp > 3000)
			this->connectResult(2);
		else
			this->udpSendStr(kcp_making_syn(m_randValue));
	}
	break;
	case State::SYN_RECV:
	{
		if (uv_now(m_loop) - m_stateTimeStamp > 5000)
			this->acceptFailed();
		else
			this->udpSendStr(kcp_making_syn_and_ack(m_randValue, this->getConv()));
	}
	break;
	case State::ESTABLISHED:
	{
		if (m_soType == KCPSOType::CLI_SO && uv_now(m_loop) - m_stateTimeStamp < 2000)
			this->udpSendStr(kcp_making_ack(this->getConv() + 1));
	}
	break;
	case State::FIN_WAIT:
	case State::CLOSE_WAIT:
		if (uv_now(m_loop) - m_stateTimeStamp > 1000)
			this->shutdownSocket();
		else
			this->udpSendStr(kcp_making_fin(getConv()));
		break;
	default:
		this->shutdownSocket();
		break;
	}

	if (m_kcpState == State::ESTABLISHED && uv_now(m_loop) - m_lastKcpRecvTime > 6000U)
	{
		m_heartbeatLoseCount++;
		m_lastKcpRecvTime = uv_now(m_loop);

		// If there is no message communication more than one minute
		if (m_heartbeatLoseCount > 9)
		{
			this->disconnect();
			return;
		}

		if (m_soType == CLI_SO)
		{
			if (m_heartbeatLoseCount >= 2)
				this->udpSendStr(kcp_making_heart_packet());
		}
		else
		{
			if (m_heartbeatLoseCount >= 5)
				this->udpSendStr(kcp_making_heart_packet());
		}
	}
}